

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O3

void __thiscall TypeTest_IndexedTypePrinter_Test::TestBody(TypeTest_IndexedTypePrinter_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Printed PVar2;
  Printed PVar3;
  Printed PVar4;
  Printed PVar5;
  Nullability NVar6;
  long *plVar7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  char *in_R9;
  pointer *__ptr;
  char *pcVar10;
  initializer_list<wasm::Field> __l;
  initializer_list<wasm::Field> __l_00;
  Array AVar11;
  Array AVar12;
  initializer_list<wasm::HeapType> __l_01;
  initializer_list<wasm::HeapType> __l_02;
  undefined8 uStack_438;
  undefined1 local_430 [8];
  StructPrinter print;
  stringstream stream;
  __node_base local_388;
  string local_380 [104];
  ios_base local_318 [272];
  Printed local_208;
  Printed local_1e0;
  Printed local_1b8;
  Printed local_190;
  undefined1 auStack_168 [8];
  ArrayPrinter printArrays;
  byte local_b8;
  undefined1 local_b0 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> structs;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> arrays;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  TypeBuilder local_38;
  TypeBuilder builder;
  
  ::wasm::TypeBuilder::TypeBuilder(&local_38,4);
  ::wasm::TypeBuilder::createRecGroup((ulong)&local_38,0);
  NVar6 = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_38);
  plVar7 = (long *)::wasm::TypeBuilder::getTempRefType((HeapType)&local_38,NVar6,Exact);
  NVar6 = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_38);
  p_Var8 = (__node_base_ptr)::wasm::TypeBuilder::getTempRefType((HeapType)&local_38,NVar6,Exact);
  NVar6 = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_38);
  p_Var9 = (__node_base_ptr)::wasm::TypeBuilder::getTempRefType((HeapType)&local_38,NVar6,Exact);
  NVar6 = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_38);
  local_430 = (undefined1  [8])::wasm::TypeBuilder::getTempRefType((HeapType)&local_38,NVar6,Exact);
  print.defaultGenerator.funcCount = 0;
  __l._M_len = 1;
  __l._M_array = (iterator)local_430;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_168,__l,
             (allocator_type *)&printArrays.names._M_h._M_single_bucket);
  print.names._M_h._M_single_bucket = (__node_base_ptr)auStack_168;
  local_388._M_nxt = (_Hash_node_base *)printArrays.defaultGenerator.contCount;
  auStack_168 = (undefined1  [8])0x0;
  printArrays.defaultGenerator.funcCount = 0;
  printArrays.defaultGenerator.contCount = 0;
  ::wasm::TypeBuilder::setHeapType((ulong)&local_38,(Struct *)0x0);
  if (print.names._M_h._M_single_bucket != (__node_base_ptr)0x0) {
    operator_delete(print.names._M_h._M_single_bucket,
                    (long)local_388._M_nxt - (long)print.names._M_h._M_single_bucket);
  }
  if (auStack_168 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_168,printArrays.defaultGenerator.contCount - (long)auStack_168);
  }
  print.defaultGenerator.funcCount = 0;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_430;
  local_430 = (undefined1  [8])plVar7;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_168,__l_00,
             (allocator_type *)&printArrays.names._M_h._M_single_bucket);
  print.names._M_h._M_single_bucket = (__node_base_ptr)auStack_168;
  local_388._M_nxt = (_Hash_node_base *)printArrays.defaultGenerator.contCount;
  auStack_168 = (undefined1  [8])0x0;
  printArrays.defaultGenerator.funcCount = 0;
  printArrays.defaultGenerator.contCount = 0;
  ::wasm::TypeBuilder::setHeapType((ulong)&local_38,(Struct *)0x1);
  if (print.names._M_h._M_single_bucket != (__node_base_ptr)0x0) {
    operator_delete(print.names._M_h._M_single_bucket,
                    (long)local_388._M_nxt - (long)print.names._M_h._M_single_bucket);
  }
  if (auStack_168 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_168,printArrays.defaultGenerator.contCount - (long)auStack_168);
  }
  AVar11.element._8_8_ = &print.names._M_h._M_single_bucket;
  AVar11.element.type.id = 2;
  print.names._M_h._M_single_bucket = p_Var8;
  ::wasm::TypeBuilder::setHeapType((ulong)&local_38,AVar11);
  AVar12.element._8_8_ = &print.names._M_h._M_single_bucket;
  AVar12.element.type.id = 3;
  print.names._M_h._M_single_bucket = p_Var9;
  ::wasm::TypeBuilder::setHeapType((ulong)&local_38,AVar12);
  ::wasm::TypeBuilder::build();
  auStack_168[0] = local_b8 == 0;
  printArrays.defaultGenerator.funcCount = 0;
  if (local_b8 == 0) {
    __x = std::
          get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                    ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      *)&printArrays.names._M_h._M_single_bucket);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &arrays.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,__x);
    print.names._M_h._M_single_bucket =
         (__node_base_ptr)
         (arrays.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage)->id;
    __l_01._M_len = 2;
    __l_01._M_array = (iterator)&print.names._M_h._M_single_bucket;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_b0,__l_01,
               (allocator_type *)auStack_168);
    print.names._M_h._M_single_bucket =
         (__node_base_ptr)
         arrays.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage[2].id;
    __l_02._M_len = 2;
    __l_02._M_array = (iterator)&print.names._M_h._M_single_bucket;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &structs.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,__l_02,(allocator_type *)auStack_168);
    print.names._M_h._M_single_bucket = (__node_base_ptr)&local_388;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&print.names._M_h._M_single_bucket,"array","");
    ::wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::
    IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
              ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)auStack_168,
               (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &structs.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(DefaultTypeNameGenerator *)auStack_168,
               (string *)&print.names._M_h._M_single_bucket);
    if ((ostream *)print.names._M_h._M_single_bucket != (ostream *)&local_388) {
      operator_delete(print.names._M_h._M_single_bucket,
                      (ulong)((long)&(local_388._M_nxt)->_M_nxt + 1));
    }
    print.names._M_h._M_single_bucket = (__node_base_ptr)&local_388;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&print.names._M_h._M_single_bucket,"struct","");
    ::wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>>
    ::IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
              ((IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>>
                *)local_430,(vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_b0,
               (IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)auStack_168,
               (string *)&print.names._M_h._M_single_bucket);
    if ((ostream *)print.names._M_h._M_single_bucket != (ostream *)&local_388) {
      operator_delete(print.names._M_h._M_single_bucket,
                      (ulong)((long)&(local_388._M_nxt)->_M_nxt + 1));
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&print.names._M_h._M_single_bucket);
    ::wasm::
    TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
    ::operator()(&local_208,
                 (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
                  *)local_430,
                 (HeapType)
                 (arrays.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage)->id);
    PVar2.generateName.super__Function_base._M_functor._M_unused._M_object = (void *)local_430;
    PVar2.typeID = uStack_438;
    PVar2.generateName.super__Function_base._M_functor._8_8_ = print.defaultGenerator.funcCount;
    PVar2.generateName.super__Function_base._M_manager =
         (_Manager_type)print.defaultGenerator.contCount;
    PVar2.generateName._M_invoker = (_Invoker_type)print.defaultGenerator.structCount;
    ::wasm::operator<<((ostream *)&local_388,PVar2);
    if (local_208.generateName.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_208.generateName.super__Function_base._M_manager)
                ((_Any_data *)&local_208.generateName,(_Any_data *)&local_208.generateName,
                 __destroy_functor);
    }
    std::__cxx11::stringbuf::str();
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[52]>
              ((internal *)
               &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,"stream.str()",
               "\"(type $struct0 (struct (field (ref null $array1))))\"",&local_58,
               (char (*) [52])"(type $struct0 (struct (field (ref null $array1))))");
    paVar1 = &local_58.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((char)built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage == '\0') {
      testing::Message::Message((Message *)&local_58);
      if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = (local_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&builder,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x70,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&builder,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&builder);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_58._M_dataplus._M_p + 8))();
      }
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    pcVar10 = "";
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"","");
    std::__cxx11::stringbuf::str(local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    ::wasm::
    TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
    ::operator()(&local_1e0,
                 (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
                  *)local_430,
                 (HeapType)
                 arrays.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[1].id);
    PVar3.generateName.super__Function_base._M_functor._M_unused._M_object = (void *)local_430;
    PVar3.typeID = uStack_438;
    PVar3.generateName.super__Function_base._M_functor._8_8_ = print.defaultGenerator.funcCount;
    PVar3.generateName.super__Function_base._M_manager =
         (_Manager_type)print.defaultGenerator.contCount;
    PVar3.generateName._M_invoker = (_Invoker_type)print.defaultGenerator.structCount;
    ::wasm::operator<<((ostream *)&local_388,PVar3);
    if (local_1e0.generateName.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_1e0.generateName.super__Function_base._M_manager)
                ((_Any_data *)&local_1e0.generateName,(_Any_data *)&local_1e0.generateName,
                 __destroy_functor);
    }
    std::__cxx11::stringbuf::str();
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[53]>
              ((internal *)
               &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,"stream.str()",
               "\"(type $struct1 (struct (field (ref null $struct0))))\"",&local_58,
               (char (*) [53])"(type $struct1 (struct (field (ref null $struct0))))");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((char)built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage == '\0') {
      testing::Message::Message((Message *)&local_58);
      if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = (local_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&builder,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x75,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&builder,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&builder);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_58._M_dataplus._M_p + 8))();
      }
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    pcVar10 = "";
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"","");
    std::__cxx11::stringbuf::str(local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    ::wasm::
    TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
    ::operator()(&local_1b8,
                 (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
                  *)local_430,
                 (HeapType)
                 arrays.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[2].id);
    PVar4.generateName.super__Function_base._M_functor._M_unused._M_object = (void *)local_430;
    PVar4.typeID = uStack_438;
    PVar4.generateName.super__Function_base._M_functor._8_8_ = print.defaultGenerator.funcCount;
    PVar4.generateName.super__Function_base._M_manager =
         (_Manager_type)print.defaultGenerator.contCount;
    PVar4.generateName._M_invoker = (_Invoker_type)print.defaultGenerator.structCount;
    ::wasm::operator<<((ostream *)&local_388,PVar4);
    if (local_1b8.generateName.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_1b8.generateName.super__Function_base._M_manager)
                ((_Any_data *)&local_1b8.generateName,(_Any_data *)&local_1b8.generateName,
                 __destroy_functor);
    }
    std::__cxx11::stringbuf::str();
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[43]>
              ((internal *)
               &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,"stream.str()",
               "\"(type $array0 (array (ref null $struct1)))\"",&local_58,
               (char (*) [43])"(type $array0 (array (ref null $struct1)))");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((char)built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage == '\0') {
      testing::Message::Message((Message *)&local_58);
      if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = (local_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&builder,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x79,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&builder,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&builder);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_58._M_dataplus._M_p + 8))();
      }
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    pcVar10 = "";
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"","");
    std::__cxx11::stringbuf::str(local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    ::wasm::
    TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
    ::operator()(&local_190,
                 (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
                  *)local_430,
                 (HeapType)
                 arrays.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[3].id);
    PVar5.generateName.super__Function_base._M_functor._M_unused._M_object = (void *)local_430;
    PVar5.typeID = uStack_438;
    PVar5.generateName.super__Function_base._M_functor._8_8_ = print.defaultGenerator.funcCount;
    PVar5.generateName.super__Function_base._M_manager =
         (_Manager_type)print.defaultGenerator.contCount;
    PVar5.generateName._M_invoker = (_Invoker_type)print.defaultGenerator.structCount;
    ::wasm::operator<<((ostream *)&local_388,PVar5);
    if (local_190.generateName.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_190.generateName.super__Function_base._M_manager)
                ((_Any_data *)&local_190.generateName,(_Any_data *)&local_190.generateName,
                 __destroy_functor);
    }
    std::__cxx11::stringbuf::str();
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[42]>
              ((internal *)
               &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,"stream.str()",
               "\"(type $array1 (array (ref null $array0)))\"",&local_58,
               (char (*) [42])"(type $array1 (array (ref null $array0)))");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((char)built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage == '\0') {
      testing::Message::Message((Message *)&local_58);
      if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = (local_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&builder,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x7d,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&builder,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&builder);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_58._M_dataplus._M_p + 8))();
      }
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&print.names._M_h._M_single_bucket);
    std::ios_base::~ios_base(local_318);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&print.fallback);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&print.defaultGenerator.arrayCount);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&printArrays.fallback);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&printArrays.defaultGenerator.arrayCount);
    if (structs.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(structs.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)arrays.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)structs.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (local_b0 != (undefined1  [8])0x0) {
      operator_delete((void *)local_b0,
                      (long)structs.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)local_b0);
    }
    if (arrays.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(arrays.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)built.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)arrays.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  else {
    testing::Message::Message((Message *)local_430);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&print.names._M_h._M_single_bucket,(internal *)auStack_168,
               (AssertionResult *)"result","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x61,(char *)print.names._M_h._M_single_bucket);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)local_430);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (print.names._M_h._M_single_bucket != &local_388) {
      operator_delete(print.names._M_h._M_single_bucket,
                      (ulong)((long)&(local_388._M_nxt)->_M_nxt + 1));
    }
    if (local_430 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_430 + 8))();
    }
    if (printArrays.defaultGenerator.funcCount != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&printArrays,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   printArrays.defaultGenerator.funcCount);
    }
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr[local_b8]._M_data)
            ((anon_class_1_0_00000001 *)&print.names._M_h._M_single_bucket,
             (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              *)&printArrays.names._M_h._M_single_bucket);
  ::wasm::TypeBuilder::~TypeBuilder(&local_38);
  return;
}

Assistant:

TEST_F(TypeTest, IndexedTypePrinter) {
  TypeBuilder builder(4);
  builder.createRecGroup(0, 4);

  Type refStructA = builder.getTempRefType(builder[0], Nullable);
  Type refStructB = builder.getTempRefType(builder[1], Nullable);
  Type refArrayA = builder.getTempRefType(builder[2], Nullable);
  Type refArrayB = builder.getTempRefType(builder[3], Nullable);
  builder[0] = Struct({Field(refArrayB, Immutable)});
  builder[1] = Struct({Field(refStructA, Immutable)});
  builder[2] = Array(Field(refStructB, Immutable));
  builder[3] = Array(Field(refArrayA, Immutable));

  auto result = builder.build();
  ASSERT_TRUE(result);
  auto built = *result;

  std::vector<HeapType> structs{built[0], built[1]};
  std::vector<HeapType> arrays{built[2], built[3]};

  // Check that IndexedTypePrinters configured with fallbacks work correctly.
  using ArrayPrinter = IndexedTypeNameGenerator<DefaultTypeNameGenerator>;
  ArrayPrinter printArrays(arrays, "array");
  using StructPrinter = IndexedTypeNameGenerator<ArrayPrinter>;
  StructPrinter print(structs, printArrays, "struct");

  std::stringstream stream;
  stream << print(built[0]);
  EXPECT_EQ(stream.str(),
            "(type $struct0 (struct (field (ref null $array1))))");

  stream.str("");
  stream << print(built[1]);
  EXPECT_EQ(stream.str(),
            "(type $struct1 (struct (field (ref null $struct0))))");

  stream.str("");
  stream << print(built[2]);
  EXPECT_EQ(stream.str(), "(type $array0 (array (ref null $struct1)))");

  stream.str("");
  stream << print(built[3]);
  EXPECT_EQ(stream.str(), "(type $array1 (array (ref null $array0)))");
}